

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnnvalue * parsevalue(rnndb *db,char *file,xmlNode *node)

{
  xmlAttr *attr;
  xmlChar *__s1;
  rnndb *db_00;
  int iVar1;
  rnnvalue *prVar2;
  char *pcVar3;
  uint64_t uVar4;
  xmlNode *node_00;
  _xmlAttr **pp_Var5;
  _xmlNode **pp_Var6;
  char *local_38;
  
  prVar2 = (rnnvalue *)calloc(0x68,1);
  prVar2->file = file;
  local_38 = (char *)0x0;
  pp_Var5 = &node->properties;
  while (attr = *pp_Var5, attr != (xmlAttr *)0x0) {
    __s1 = attr->name;
    iVar1 = strcmp((char *)__s1,"name");
    if (iVar1 == 0) {
      pcVar3 = getattrib(db,file,(uint)node->line,attr);
      local_38 = strdup(pcVar3);
      prVar2->name = local_38;
    }
    else {
      iVar1 = strcmp((char *)__s1,"value");
      if (iVar1 == 0) {
        uVar4 = getnumattrib(db,file,(uint)node->line,attr);
        prVar2->value = uVar4;
        prVar2->valvalid = 1;
      }
      else {
        iVar1 = strcmp((char *)__s1,"varset");
        if (iVar1 == 0) {
          pcVar3 = getattrib(db,file,(uint)node->line,attr);
          pcVar3 = strdup(pcVar3);
          (prVar2->varinfo).varsetstr = pcVar3;
        }
        else {
          iVar1 = strcmp((char *)__s1,"variants");
          if (iVar1 == 0) {
            pcVar3 = getattrib(db,file,(uint)node->line,attr);
            pcVar3 = strdup(pcVar3);
            (prVar2->varinfo).variantsstr = pcVar3;
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for value\n",file,(ulong)node->line,__s1)
            ;
            db->estatus = 1;
          }
        }
      }
    }
    pp_Var5 = &attr->next;
  }
  pp_Var6 = &node->children;
  while (db_00 = (rnndb *)*pp_Var6, db_00 != (rnndb *)0x0) {
    if (*(int *)&(db_00->copyright).license == 1) {
      pcVar3 = file;
      iVar1 = trytop(db,file,(xmlNode *)db_00);
      if (iVar1 == 0) {
        iVar1 = trydoc(db_00,pcVar3,node_00);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)*(ushort *)&db_00->files,
                  node->name,(db_00->copyright).authors);
          db->estatus = 1;
        }
      }
    }
    pp_Var6 = (_xmlNode **)&db_00->bitsets;
  }
  if (local_38 == (char *)0x0) {
    prVar2 = (rnnvalue *)0x0;
    fprintf(_stderr,"%s:%d: nameless value\n",file,(ulong)node->line);
    db->estatus = 1;
  }
  return prVar2;
}

Assistant:

static struct rnnvalue *parsevalue(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnvalue *val = calloc(sizeof *val, 1);
	val->file = file;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			val->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "value")) {
			val->value = getnumattrib(db, file, node->line, attr);
			val->valvalid = 1;
		} else if (!strcmp(attr->name, "varset")) {
			val->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			val->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for value\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!val->name) {
		fprintf (stderr, "%s:%d: nameless value\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
		return val;
	}
}